

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeeki.c
# Opt level: O2

int main(int argc,char **argv)

{
  void *pvVar1;
  bool bVar2;
  nva_card **ppnVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char *__ptr;
  uint32_t uVar8;
  undefined1 *puVar9;
  long lVar10;
  size_t sStack_150;
  undefined1 auStack_148 [4];
  int32_t b;
  int32_t a;
  int cnum;
  uint32_t z [64];
  
  iVar5 = nva_init();
  if (iVar5 == 0) {
    cnum = 0;
    do {
      while (iVar5 = getopt(argc,argv,"c:"), iVar5 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar5 != -1);
    if (cnum < nva_cardsnum) {
      b = 4;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&a);
        a = a & 0xfffffffc;
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&b);
          iVar5 = b;
        }
        else {
          iVar5 = 4;
        }
        bVar2 = true;
        while (ppnVar3 = nva_cards, 0 < iVar5) {
          uVar6 = 0;
          for (uVar7 = 0; pvVar1 = ppnVar3[cnum]->bar0, uVar7 != 0x40; uVar7 = uVar7 + 1) {
            *(int *)((long)pvVar1 + ((ulong)(uint)a | 0xffc)) = (int)uVar7;
            uVar8 = *(uint32_t *)((long)ppnVar3[cnum]->bar0 + (ulong)(uint)a);
            z[uVar7] = uVar8;
            if (uVar8 != 0) {
              uVar8 = 1 << ((byte)(uVar7 >> 2) & 0x1f);
            }
            uVar6 = uVar6 | uVar8;
          }
          *(undefined4 *)((long)pvVar1 + ((ulong)(uint)a | 0xffc)) = 0;
          puVar9 = auStack_148;
          for (lVar10 = 0; puVar9 = puVar9 + 0x10, lVar10 != 0x10; lVar10 = lVar10 + 1) {
            if ((uVar6 >> ((uint)lVar10 & 0x1f) & 1) == 0) {
              bVar4 = false;
              if (bVar2) {
                puts("...");
              }
            }
            else {
              printf("%08x.%02x:",(ulong)(uint)a,(ulong)((uint)lVar10 << 4));
              for (uVar7 = 0; (uVar7 < 4 && ((long)uVar7 < (long)b)); uVar7 = uVar7 + 1) {
                printf(" %08x",(ulong)*(uint *)(puVar9 + uVar7 * 4));
              }
              putchar(10);
              bVar4 = true;
            }
            bVar2 = bVar4;
          }
          a = a + 4;
          b = b + -4;
          iVar5 = b;
        }
        return 0;
      }
      __ptr = "No address specified.\n";
      sStack_150 = 0x16;
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_150 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_150 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_150 = 0x12;
  }
  fwrite(__ptr,sStack_150,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	a &= ~3;
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	while (b > 0) {
		uint32_t selector = a|0xffc;
		uint32_t z[0x40];
		int s = 0, j;
		for (i = 0; i < 0x40; i++) {
			nva_wr32(cnum, selector, i);
			if ((z[i] = nva_rd32(cnum, a))) s |= 1 << (i/4);
		}
		nva_wr32(cnum, selector, 0);
		for (j = 0; j < 0x10; ++j) {
			if (s & (1<<j)) {
				ls = 1;
				printf ("%08x.%02x:", a, j * 0x10);
				for (i = 0; i < 4 && i < b; i++) {
					printf (" %08x", z[i + j*4]);
				}
				printf ("\n");
			} else  {
				if (ls) printf ("...\n"), ls = 0;
			}
		}
		a+=4;
		b-=4;
	}
	return 0;
}